

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O2

void __thiscall Jzon::Node::add(Node *this,Node *node)

{
  Data *pDVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->data != (Data *)0x0) && (this->data->type == T_ARRAY)) {
    detach(this);
    pDVar1 = this->data;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_60,&local_38,node);
    std::
    vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
    ::emplace_back<std::pair<std::__cxx11::string,Jzon::Node>>
              ((vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
                *)&pDVar1->children,&local_60);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
    ::~pair(&local_60);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void Node::add(const Node &node)
	{
		if (isArray())
		{
			detach();
			data->children.push_back(std::make_pair(std::string(), node));
		}
	}